

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_mgau.c
# Opt level: O0

int32 model_set_mllr(ms_mgau_model_t *msg,char *mllrfile,char *cb2mllrfile,feat_t *fcb,mdef_t *mdef,
                    cmd_ln_t *config)

{
  gauden_t *pgVar1;
  int32 iVar2;
  int iVar3;
  char *pcVar4;
  double dVar5;
  int local_7c;
  uint local_78;
  int32 class;
  uint32 nmllr;
  uint32 ncb;
  uint8 *mgau_xform;
  int local_60;
  int32 nclass;
  int32 sid;
  int32 gid;
  int32 *cb2mllr;
  float32 ***H;
  float32 ***B;
  float32 ****A;
  cmd_ln_t *config_local;
  mdef_t *mdef_local;
  feat_t *fcb_local;
  char *cb2mllrfile_local;
  char *mllrfile_local;
  ms_mgau_model_t *msg_local;
  
  pgVar1 = msg->g;
  A = (float32 ****)config;
  config_local = (cmd_ln_t *)mdef;
  mdef_local = (mdef_t *)fcb;
  fcb_local = (feat_t *)cb2mllrfile;
  cb2mllrfile_local = mllrfile;
  mllrfile_local = (char *)msg;
  pcVar4 = cmd_ln_str_r(config,"-mean");
  gauden_mean_reload(pgVar1,pcVar4);
  pgVar1 = *(gauden_t **)mllrfile_local;
  pcVar4 = cmd_ln_str_r((cmd_ln_t *)A,"-var");
  gauden_var_reload(pgVar1,pcVar4);
  iVar2 = ms_mllr_read_regmat(cb2mllrfile_local,(float32 *****)&B,&H,(float32 ****)&cb2mllr,
                              (int32 *)mdef_local->ciphone_ht,mdef_local->n_tmat,
                              (int32 *)((long)&mgau_xform + 4));
  if (iVar2 < 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_mgau.c"
            ,0x60,"ms_mllr_read_regmat failed\n");
    exit(1);
  }
  if ((fcb_local == (feat_t *)0x0) || (iVar3 = strcmp((char *)fcb_local,".1cls."), iVar3 == 0)) {
    _sid = (int32 *)0x0;
  }
  else {
    cb2mllr_read((char *)fcb_local,(int32 **)&sid,(uint32 *)&class,&local_78);
    if (local_78 != mgau_xform._4_4_) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_mgau.c"
              ,0x69,"Number of classes in cb2mllr does not match mllr (%d != %d)\n",
              (ulong)(uint)class,(ulong)mgau_xform._4_4_);
      exit(1);
    }
    if (class != *(int *)(*(long *)(mllrfile_local + 8) + 0x10)) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_mgau.c"
              ,0x6d,"Number of senones in cb2mllr does not match mdef (%d != %d)\n",
              (ulong)(uint)class,(ulong)*(uint *)(*(long *)(mllrfile_local + 8) + 0x10));
      exit(1);
    }
  }
  _nmllr = __ckd_calloc__((long)*(int *)(*(long *)mllrfile_local + 0x20),1,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_mgau.c"
                          ,0x73);
  for (local_60 = 0; local_60 < *(int *)(*(long *)(mllrfile_local + 8) + 0x10);
      local_60 = local_60 + 1) {
    local_7c = 0;
    if (_sid != (int32 *)0x0) {
      local_7c = _sid[local_60];
    }
    if (((local_7c != -1) &&
        (*(short *)(*(long *)(config_local + 2) + (long)local_60 * 2) != local_60)) &&
       (nclass = (int32)*(short *)(*(long *)(*(long *)(mllrfile_local + 8) + 0x28) +
                                  (long)local_60 * 2),
       *(char *)((long)_nmllr + (long)nclass) == '\0')) {
      ms_mllr_norm_mgau(*(float32 ****)(*(long *)(*(long *)mllrfile_local + 8) + (long)nclass * 8),
                        *(float32 ****)
                         (*(long *)(*(long *)mllrfile_local + 0x10) + (long)nclass * 8),
                        *(int32 *)(*(long *)mllrfile_local + 0x28),(float32 ****)B,H,
                        (float32 ***)cb2mllr,(int32 *)mdef_local->ciphone_ht,mdef_local->n_tmat,
                        local_7c);
      *(undefined1 *)((long)_nmllr + (long)nclass) = 1;
    }
  }
  pgVar1 = *(gauden_t **)mllrfile_local;
  dVar5 = cmd_ln_float_r((cmd_ln_t *)A,"-varfloor");
  gauden_dist_precompute(pgVar1,(float32)(float)dVar5);
  ckd_free(_nmllr);
  ms_mllr_free_regmat((float32 ****)B,H,(float32 ***)cb2mllr,mdef_local->n_tmat);
  ckd_free(_sid);
  return 0;
}

Assistant:

int32
model_set_mllr(ms_mgau_model_t * msg, const char *mllrfile,
	       const char *cb2mllrfile, feat_t * fcb, mdef_t * mdef,
	       cmd_ln_t *config)
{
    float32 ****A, ***B, ***H;
    int32 *cb2mllr;
    int32 gid, sid, nclass;
    uint8 *mgau_xform;

    gauden_mean_reload(msg->g, cmd_ln_str_r(config, "-mean"));
    gauden_var_reload(msg->g, cmd_ln_str_r(config, "-var"));

    if (ms_mllr_read_regmat(mllrfile, &A, &B, &H,
                            fcb->stream_len, feat_n_stream(fcb),
                            &nclass) < 0)
        E_FATAL("ms_mllr_read_regmat failed\n");

    if (cb2mllrfile && strcmp(cb2mllrfile, ".1cls.") != 0) {
        uint32 ncb, nmllr;

        cb2mllr_read(cb2mllrfile, &cb2mllr, &ncb, &nmllr);
        if (nmllr != nclass)
            E_FATAL
                ("Number of classes in cb2mllr does not match mllr (%d != %d)\n",
                 ncb, nclass);
        if (ncb != msg->s->n_sen)
            E_FATAL
                ("Number of senones in cb2mllr does not match mdef (%d != %d)\n",
                 ncb, msg->s->n_sen);
    }
    else
        cb2mllr = NULL;


    mgau_xform = (uint8 *) ckd_calloc(msg->g->n_mgau, sizeof(uint8));

    /* Transform each non-CI mixture Gaussian */
    for (sid = 0; sid < msg->s->n_sen; sid++) {
        int32 class = 0;

        if (cb2mllr)
            class = cb2mllr[sid];
        if (class == -1)
            continue;

        if (mdef->cd2cisen[sid] != sid) {       /* Otherwise it's a CI senone */
            gid = msg->s->mgau[sid];
            if (!mgau_xform[gid]) {
                ms_mllr_norm_mgau(msg->g->mean[gid],
				  msg->g->var[gid],
				  msg->g->n_density,
				  A, B, H,
				  fcb->stream_len, feat_n_stream(fcb),
                                  class);
                mgau_xform[gid] = 1;
            }
        }
    }

    gauden_dist_precompute(msg->g, cmd_ln_float32_r(config, "-varfloor"));
    ckd_free(mgau_xform);

    ms_mllr_free_regmat(A, B, H, feat_n_stream(fcb));
    ckd_free(cb2mllr);

    return S3_SUCCESS;
}